

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ExpressionResultBuilder * __thiscall
Catch::ExpressionResultBuilder::operator<<(ExpressionResultBuilder *this,char **value)

{
  ostringstream *poVar1;
  char *__s;
  size_t sVar2;
  
  poVar1 = &this->m_stream;
  __s = *value;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar2);
  }
  return this;
}

Assistant:

ExpressionResultBuilder& operator << ( const T& value ) {
        m_stream << value;
        return *this;
    }